

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::map_slot_policy<int,float>::
     construct<std::allocator<std::pair<int_const,float>>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
               (allocator<std::pair<const_int,_float>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<const_int_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_int,_float>_> *alloc_local;
  
  map_slot_policy<int,_float>::emplace(slot);
  std::allocator_traits<std::allocator<std::pair<int_const,float>>>::
  construct<std::pair<int,float>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
            (alloc,(pair<int,_float> *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }